

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* json_parse(string *fname)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  FILE *__stream;
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  string *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_RDI;
  bool bVar6;
  int i;
  int n;
  string str_val;
  string str_key;
  bool in_token;
  bool has_key;
  ifstream ifs;
  string json;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *result;
  size_t *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  istream_type *in_stack_fffffffffffffaa8;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffab0;
  string *this;
  string *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  streambuf_type *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  streambuf_type *in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb00;
  allocator<char> local_441;
  string local_440 [39];
  undefined1 local_419 [33];
  string local_3f8 [39];
  undefined1 local_3d1 [40];
  allocator<char> local_3a9;
  string local_3a8 [32];
  string local_388;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  int local_2f4;
  int local_2f0;
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [38];
  byte local_29a;
  byte local_299;
  undefined4 local_298;
  allocator<char> local_291 [33];
  string local_270 [48];
  long local_240 [65];
  string local_38 [39];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x1202d7);
  std::__cxx11::string::string(local_38);
  std::ifstream::ifstream(local_240,local_10,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_240 + *(long *)(local_240[0] + -0x18)));
  __stream = _stderr;
  if ((bVar1 & 1) != 0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"Failed to open %s\n",uVar3);
    exit(1);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffaa0);
  std::allocator<char>::allocator();
  __beg._8_8_ = in_stack_fffffffffffffb00;
  __beg._M_sbuf = in_stack_fffffffffffffaf8;
  __end._8_8_ = in_stack_fffffffffffffaf0;
  __end._M_sbuf = in_stack_fffffffffffffae8;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffae0,__beg,__end,(allocator<char> *)in_stack_fffffffffffffad8);
  std::__cxx11::string::operator=(local_38,local_270);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(local_291);
  std::ifstream::~ifstream(local_240);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar4 == '{') {
    local_299 = 0;
    local_29a = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
               (allocator<char> *)in_stack_fffffffffffffad0);
    std::allocator<char>::~allocator(&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
               (allocator<char> *)in_stack_fffffffffffffad0);
    std::allocator<char>::~allocator(&local_2e9);
    local_2f0 = std::__cxx11::string::size();
    for (local_2f4 = 1; local_2f4 < local_2f0; local_2f4 = local_2f4 + 1) {
      if ((local_29a & 1) == 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if ((*pcVar4 != ' ') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar4 == '\"')) {
          local_29a = 1;
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if ((*pcVar4 == '\\') && (local_2f4 + 1 < local_2f0)) {
          if ((local_299 & 1) == 0) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
            std::__cxx11::string::operator+=(local_2c0,*pcVar4);
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
            std::__cxx11::string::operator+=(local_2e8,*pcVar4);
          }
          local_2f4 = local_2f4 + 1;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar4 == '\"') {
            if ((local_299 & 1) == 0) {
              local_299 = 1;
              do {
                local_2f4 = local_2f4 + 1;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
              } while (*pcVar4 == ' ');
              do {
                local_2f4 = local_2f4 + 1;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
              } while (*pcVar4 == ' ');
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
              if (*pcVar4 == '\"') {
                local_29a = 1;
                goto LAB_00120e7d;
              }
              while( true ) {
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
                bVar6 = false;
                if (*pcVar4 != ',') {
                  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
                  bVar6 = *pcVar4 != '}';
                }
                if (!bVar6) break;
                local_2f4 = local_2f4 + 1;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
                std::__cxx11::string::operator+=(local_2e8,*pcVar4);
              }
            }
            local_299 = 0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            replace(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
            in_stack_fffffffffffffae0 = &local_318;
            std::__cxx11::string::operator=(local_2c0,(string *)in_stack_fffffffffffffae0);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffffae0);
            std::__cxx11::string::~string(local_360);
            std::allocator<char>::~allocator(&local_361);
            std::__cxx11::string::~string(local_338);
            std::allocator<char>::~allocator(&local_339);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            in_stack_fffffffffffffad8 = (string *)local_3d1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            replace(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
            in_stack_fffffffffffffac8 = &local_388;
            std::__cxx11::string::operator=(local_2c0,(string *)in_stack_fffffffffffffac8);
            std::__cxx11::string::~string((string *)in_stack_fffffffffffffac8);
            std::__cxx11::string::~string((string *)(local_3d1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_3d1);
            std::__cxx11::string::~string(local_3a8);
            std::allocator<char>::~allocator(&local_3a9);
            in_stack_fffffffffffffad0 = (string *)local_419;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8,
                       (allocator<char> *)in_stack_fffffffffffffad0);
            replace(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
            this = local_3f8;
            std::__cxx11::string::operator=(local_2c0,this);
            std::__cxx11::string::~string(this);
            std::__cxx11::string::~string(local_440);
            std::allocator<char>::~allocator(&local_441);
            std::__cxx11::string::~string((string *)(local_419 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_419);
            iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,0);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            *pmVar5 = iVar2;
            std::__cxx11::string::operator=(local_2c0,"");
            std::__cxx11::string::operator=(local_2e8,"");
            local_29a = 0;
            goto LAB_00120e7d;
          }
        }
        if ((local_299 & 1) == 0) {
          in_stack_fffffffffffffaa0 = (string *)std::__cxx11::string::operator[]((ulong)local_38);
          std::__cxx11::string::operator+=(local_2c0,(char)in_stack_fffffffffffffaa0->_M_dataplus);
        }
        else {
          in_stack_fffffffffffffa98 = (size_t *)std::__cxx11::string::operator[]((ulong)local_38);
          std::__cxx11::string::operator+=(local_2e8,(char)*in_stack_fffffffffffffa98);
        }
      }
LAB_00120e7d:
    }
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_2c0);
  }
  local_11 = 1;
  local_298 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)0x120f20);
  }
  return in_RDI;
}

Assistant:

std::map<std::string, int32_t> json_parse(const std::string & fname) {
    std::map<std::string, int32_t> result;

    // read file into string
    std::string json;
    {
        std::ifstream ifs(fname);
        if (!ifs) {
            fprintf(stderr, "Failed to open %s\n", fname.c_str());
            exit(1);
        }

        json = std::string((std::istreambuf_iterator<char>(ifs)),
                (std::istreambuf_iterator<char>()));
    }

    if (json[0] != '{') {
        return result;
    }

    // parse json
    {
        bool has_key  = false;
        bool in_token = false;

        std::string str_key = "";
        std::string str_val = "";

        int n = json.size();
        for (int i = 1; i < n; ++i) {
            if (!in_token) {
                if (json[i] == ' ') continue;
                if (json[i] == '"') {
                    in_token = true;
                    continue;
                }
            } else {
                if (json[i] == '\\' && i+1 < n) {
                    if (has_key == false) {
                        str_key += json[i];
                    } else {
                        str_val += json[i];
                    }
                    ++i;
                } else if (json[i] == '"') {
                    if (has_key == false) {
                        has_key = true;
                        ++i;
                        while (json[i] == ' ') ++i;
                        ++i; // :
                        while (json[i] == ' ') ++i;
                        if (json[i] != '\"') {
                            while (json[i] != ',' && json[i] != '}') {
                                str_val += json[i++];
                            }
                            has_key = false;
                        } else {
                            in_token = true;
                            continue;
                        }
                    } else {
                        has_key = false;
                    }

                    str_key = ::replace(str_key, "\\u0120", " " ); // \u0120 -> space
                    str_key = ::replace(str_key, "\\u010a", "\n"); // \u010a -> new line
                    str_key = ::replace(str_key, "\\\"",    "\""); // \\\"   -> "

                    try {
                        result[str_key] = std::stoi(str_val);
                    } catch (...) {
                        //fprintf(stderr, "%s: ignoring key '%s' with value '%s'\n", fname.c_str(), str_key.c_str(), str_val.c_str());

                    }
                    str_key = "";
                    str_val = "";
                    in_token = false;
                    continue;
                }
                if (has_key == false) {
                    str_key += json[i];
                } else {
                    str_val += json[i];
                }
            }
        }
    }

    return result;
}